

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  long lVar2;
  ErrnoSaver EVar3;
  bool bVar4;
  uint uVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  char *pcVar8;
  Nonnull<const_char_*> failure_msg;
  int iVar9;
  uint *puVar10;
  Arena *arena;
  MessageLite *unaff_R13;
  long *plVar11;
  ushort *puVar12;
  pair<const_char_*,_int> pVar13;
  TcParseTableBase *unaff_retaddr;
  ErrnoSaver local_48;
  char *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar10 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar10 & 3) != 0) {
      AlignFail(puVar10);
    }
    *puVar10 = *puVar10 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar11 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar11 & 7) != 0) {
    AlignFail(plVar11);
  }
  lVar1 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar11 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(*(ClassData **)(lVar1 + 0x20),arena);
    *plVar11 = (long)pMVar6;
  }
  if (ptr[1] < '\0') {
    pVar13 = ReadSizeFallback(ptr + 1,(uint)(byte)ptr[1]);
    puVar12 = (ushort *)pVar13.first;
    if (puVar12 == (ushort *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    puVar12 = (ushort *)(ptr + 2);
  }
  if (ctx->depth_ < 1) {
    return (char *)0x0;
  }
  EpsCopyInputStream::PushLimit
            ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)puVar12);
  EVar3.saved_errno_ = local_48.saved_errno_;
  local_38 = (char *)((long)ctx->depth_ + -1);
  ctx->depth_ = (int)local_38;
  lVar2 = *plVar11;
  _local_48 = puVar12;
  while (bVar4 = EpsCopyInputStream::DoneWithCheck<false>
                           (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffb8,
                            ctx->group_depth_), !bVar4) {
    uVar5 = (uint)*(byte *)(lVar1 + 8) & (uint)*_local_48;
    if ((uVar5 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar7 = (ulong)(uVar5 & 0xfffffff8);
    _local_48 = (ushort *)
                (**(code **)(lVar1 + 0x38 + uVar7 * 2))
                          (lVar2,_local_48,ctx,
                           (ulong)*_local_48 ^ *(ulong *)(lVar1 + 0x40 + uVar7 * 2),lVar1,0);
    if ((_local_48 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((*(byte *)(lVar1 + 9) & 1) == 0) {
    if (_local_48 == (ushort *)0x0) {
      VerifyHasBitConsistency(unaff_R13,unaff_retaddr);
      puVar12 = _local_48;
      goto LAB_00435202;
    }
    iVar9 = ctx->depth_;
    puVar12 = _local_48;
  }
  else {
    puVar12 = (ushort *)(**(code **)(lVar1 + 0x28))(lVar2,_local_48,ctx);
LAB_00435202:
    iVar9 = ctx->depth_;
    if (puVar12 == (ushort *)0x0) {
      puVar12 = (ushort *)0x0;
      goto LAB_0043514c;
    }
  }
  if ((int)local_38 != iVar9) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)local_38,(long)iVar9,"old_depth == depth_");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffb8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x481,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffb8);
  }
LAB_0043514c:
  ctx->depth_ = iVar9 + 1;
  uVar5 = EVar3.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
  (ctx->super_EpsCopyInputStream).limit_ = uVar5;
  if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) {
    return (char *)0x0;
  }
  (ctx->super_EpsCopyInputStream).limit_end_ =
       (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5);
  return (char *)puVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}